

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::BVHNIntersector1<4,_16781328,_true,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 (*pauVar22) [16];
  void *pvVar23;
  ulong uVar24;
  uint uVar25;
  void *in_R8;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  float fVar30;
  float fVar31;
  float fVar50;
  float fVar52;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar51;
  float fVar53;
  float fVar54;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  vint4 bi;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar72;
  float fVar74;
  vfloat4 a0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar73;
  float fVar75;
  float fVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai_3;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar87;
  float fVar92;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar100;
  vint4 ai;
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar105;
  float fVar107;
  undefined1 auVar103 [16];
  float fVar106;
  float fVar108;
  float fVar109;
  undefined1 auVar104 [16];
  vint4 bi_1;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  vint4 ai_1;
  float fVar115;
  float fVar116;
  float fVar117;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  RayHit *local_10f0;
  Intersectors *local_10e8;
  RayQueryContext *local_10e0;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10e0 = context;
  local_10e8 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1038 = aVar6.x;
    local_1048 = aVar6.y;
    local_1028 = aVar6.z;
    auVar32 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar64 = rsqrtss(auVar32,auVar32);
    fVar30 = auVar64._0_4_;
    local_fb8[0] = fVar30 * 1.5 - fVar30 * fVar30 * auVar32._0_4_ * 0.5 * fVar30;
    auVar91._0_4_ = local_1038 * local_fb8[0];
    auVar91._4_4_ = local_1048 * local_fb8[0];
    auVar91._8_4_ = local_1028 * local_fb8[0];
    auVar91._12_4_ = aVar6.field_3.w * local_fb8[0];
    uVar26 = CONCAT44(auVar91._4_4_,auVar91._4_4_);
    auVar33._0_8_ = uVar26 ^ 0x8000000080000000;
    auVar33._8_4_ = -auVar91._12_4_;
    auVar33._12_4_ = -auVar91._12_4_;
    auVar83._0_12_ = ZEXT812(0);
    auVar83._12_4_ = 0;
    auVar33 = blendps(auVar33,auVar83,0xe);
    auVar32._4_4_ = auVar33._0_4_;
    auVar32._0_4_ = auVar91._8_4_;
    auVar32._8_4_ = auVar33._4_4_;
    auVar32._12_4_ = 0;
    auVar64._4_4_ = auVar33._0_4_;
    auVar64._0_4_ = auVar91._8_4_;
    auVar64._8_4_ = auVar33._4_4_;
    auVar64._12_4_ = 0;
    auVar103 = dpps(auVar64 << 0x20,auVar32 << 0x20,0x7f);
    uVar26 = CONCAT44(auVar91._12_4_,auVar91._8_4_);
    auVar88._0_8_ = uVar26 ^ 0x8000000080000000;
    auVar88._8_4_ = -auVar91._8_4_;
    auVar88._12_4_ = -auVar91._12_4_;
    auVar33 = insertps(auVar88,auVar91,0x2a);
    auVar64 = dpps(auVar33,auVar33,0x7f);
    iVar29 = -(uint)(auVar64._0_4_ < auVar103._0_4_);
    auVar103._4_4_ = iVar29;
    auVar103._0_4_ = iVar29;
    auVar103._8_4_ = iVar29;
    auVar103._12_4_ = iVar29;
    auVar32 = blendvps(auVar33,auVar32 << 0x20,auVar103);
    auVar64 = dpps(auVar32,auVar32,0x7f);
    auVar33 = rsqrtss(auVar64,auVar64);
    fVar30 = auVar33._0_4_;
    fVar30 = fVar30 * 1.5 - fVar30 * fVar30 * auVar64._0_4_ * 0.5 * fVar30;
    fVar31 = fVar30 * auVar32._0_4_;
    fVar50 = fVar30 * auVar32._4_4_;
    fVar52 = fVar30 * auVar32._8_4_;
    fVar30 = fVar30 * auVar32._12_4_;
    fVar87 = fVar50 * auVar91._0_4_ - auVar91._4_4_ * fVar31;
    fVar92 = fVar52 * auVar91._4_4_ - auVar91._8_4_ * fVar50;
    fVar93 = fVar31 * auVar91._8_4_ - auVar91._0_4_ * fVar52;
    auVar89._12_4_ = fVar30 * auVar91._12_4_ - auVar91._12_4_ * fVar30;
    auVar89._0_8_ = CONCAT44(fVar93,fVar92);
    auVar89._8_4_ = fVar87;
    auVar99._8_4_ = fVar87;
    auVar99._0_8_ = auVar89._0_8_;
    auVar99._12_4_ = auVar89._12_4_;
    auVar32 = dpps(auVar99,auVar89,0x7f);
    auVar64 = rsqrtss(auVar32,auVar32);
    fVar30 = auVar64._0_4_;
    fVar30 = fVar30 * 1.5 - fVar30 * fVar30 * auVar32._0_4_ * 0.5 * fVar30;
    local_f88._4_4_ = fVar30 * fVar87;
    local_f88._0_4_ = fVar52;
    local_f88._8_4_ = auVar91._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar30 * fVar93;
    local_f98._0_4_ = fVar50;
    local_f98._8_4_ = auVar91._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar30 * fVar92;
    local_fa8._0_4_ = fVar31;
    local_fa8._8_4_ = auVar91._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    pauVar22 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar30 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar31 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar50 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar52 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar87 = 0.0;
    if (0.0 <= fVar52) {
      fVar87 = fVar52;
    }
    auVar34._4_4_ = -(uint)(ABS(local_1048) < 1e-18);
    auVar34._0_4_ = -(uint)(ABS(local_1038) < 1e-18);
    auVar34._8_4_ = -(uint)(ABS(local_1028) < 1e-18);
    auVar34._12_4_ = -(uint)(ABS(aVar6.field_3.w) < 1e-18);
    auVar32 = divps(_DAT_01f7ba10,(undefined1  [16])aVar6);
    auVar32 = blendvps(auVar32,_DAT_01fab950,auVar34);
    fVar52 = (ray->super_RayK<1>).tfar;
    fVar92 = 0.0;
    if (0.0 <= fVar52) {
      fVar92 = fVar52;
    }
    fVar52 = auVar32._0_4_ * 0.99999964;
    fVar111 = auVar32._4_4_ * 0.99999964;
    fVar113 = auVar32._8_4_ * 0.99999964;
    fVar102 = auVar32._0_4_ * 1.0000004;
    fVar105 = auVar32._4_4_ * 1.0000004;
    fVar107 = auVar32._8_4_ * 1.0000004;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    uVar26 = (ulong)(fVar52 < 0.0) * 0x10;
    uVar28 = (ulong)(fVar111 < 0.0) << 4 | 0x20;
    uVar27 = (ulong)(fVar113 < 0.0) << 4 | 0x40;
    local_1078 = fVar50;
    fStack_1074 = fVar50;
    fStack_1070 = fVar50;
    fStack_106c = fVar50;
    local_1088 = fVar87;
    fStack_1084 = fVar87;
    fStack_1080 = fVar87;
    fStack_107c = fVar87;
    local_1098 = fVar107;
    fStack_1094 = fVar107;
    fStack_1090 = fVar107;
    fStack_108c = fVar107;
    local_10a8 = fVar113;
    fStack_10a4 = fVar113;
    fStack_10a0 = fVar113;
    fStack_109c = fVar113;
    local_10b8 = fVar30;
    fStack_10b4 = fVar30;
    fStack_10b0 = fVar30;
    fStack_10ac = fVar30;
    local_10c8 = fVar52;
    fStack_10c4 = fVar52;
    fStack_10c0 = fVar52;
    fStack_10bc = fVar52;
    local_10d8 = fVar111;
    fStack_10d4 = fVar111;
    fStack_10d0 = fVar111;
    fStack_10cc = fVar111;
    local_1108 = fVar102;
    fStack_1104 = fVar102;
    fStack_1100 = fVar102;
    fStack_10fc = fVar102;
    local_1118 = fVar105;
    fStack_1114 = fVar105;
    fStack_1110 = fVar105;
    fStack_110c = fVar105;
    local_10f0 = ray;
    fVar55 = fVar92;
    fVar56 = fVar92;
    fVar57 = fVar92;
    fVar93 = fVar52;
    fVar51 = fVar52;
    fVar94 = fVar52;
    fVar86 = fVar87;
    fVar53 = fVar87;
    fVar95 = fVar87;
    fVar54 = fVar113;
    fVar62 = fVar113;
    fVar63 = fVar113;
    fVar72 = fVar30;
    fVar73 = fVar30;
    fVar74 = fVar30;
    fVar75 = fVar111;
    fVar76 = fVar111;
    fVar96 = fVar111;
    fVar97 = fVar50;
    fVar98 = fVar50;
    fVar100 = fVar50;
    fVar110 = fVar102;
    fVar112 = fVar102;
    fVar114 = fVar102;
    fVar115 = fVar105;
    fVar116 = fVar105;
    fVar117 = fVar105;
    fVar106 = fVar107;
    fVar108 = fVar107;
    fVar109 = fVar107;
    do {
      pauVar17 = pauVar22 + -1;
      pauVar22 = pauVar22 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar17 + 8) < *pfVar1 || *(float *)((long)*pauVar17 + 8) == *pfVar1) {
        pvVar23 = *(void **)*pauVar22;
        while (((ulong)pvVar23 & 8) == 0) {
          fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar25 = (uint)pvVar23 & 7;
          uVar24 = (ulong)pvVar23 & 0xfffffffffffffff0;
          if (uVar25 == 3) {
            local_fd8 = *(float *)(uVar24 + 0x20);
            fStack_fd4 = *(float *)(uVar24 + 0x24);
            fStack_fd0 = *(float *)(uVar24 + 0x28);
            fStack_fcc = *(float *)(uVar24 + 0x2c);
            local_1058 = *(undefined8 *)(uVar24 + 0x30);
            uStack_1050 = *(undefined8 *)(uVar24 + 0x38);
            uVar20 = local_1058;
            uVar21 = uStack_1050;
            local_ff8 = *(float *)(uVar24 + 0x50);
            fStack_ff4 = *(float *)(uVar24 + 0x54);
            fStack_ff0 = *(float *)(uVar24 + 0x58);
            fStack_fec = *(float *)(uVar24 + 0x5c);
            local_fe8 = *(float *)(uVar24 + 0x60);
            fStack_fe4 = *(float *)(uVar24 + 100);
            fStack_fe0 = *(float *)(uVar24 + 0x68);
            fStack_fdc = *(float *)(uVar24 + 0x6c);
            local_1018 = *(float *)(uVar24 + 0x80);
            fStack_1014 = *(float *)(uVar24 + 0x84);
            fStack_1010 = *(float *)(uVar24 + 0x88);
            fStack_100c = *(float *)(uVar24 + 0x8c);
            local_1008 = *(float *)(uVar24 + 0x90);
            fStack_1004 = *(float *)(uVar24 + 0x94);
            fStack_1000 = *(float *)(uVar24 + 0x98);
            fStack_ffc = *(float *)(uVar24 + 0x9c);
            local_1068 = *(undefined8 *)(uVar24 + 0xa0);
            uStack_1060 = *(undefined8 *)(uVar24 + 0xa8);
            uVar18 = local_1068;
            uVar19 = uStack_1060;
            fVar96 = 1.0 - fVar5;
            fVar97 = fVar96 * 0.0;
            local_fc8 = *(float *)(uVar24 + 0xf0) * fVar5 + fVar97;
            fStack_fc4 = *(float *)(uVar24 + 0xf4) * fVar5 + fVar97;
            fStack_fc0 = *(float *)(uVar24 + 0xf8) * fVar5 + fVar97;
            fStack_fbc = *(float *)(uVar24 + 0xfc) * fVar5 + fVar97;
            auVar101._0_4_ =
                 local_1038 * local_fd8 + local_1048 * local_ff8 + local_1028 * local_1018;
            auVar101._4_4_ =
                 fStack_1034 * fStack_fd4 + fStack_1044 * fStack_ff4 + fStack_1024 * fStack_1014;
            auVar101._8_4_ =
                 fStack_1030 * fStack_fd0 + fStack_1040 * fStack_ff0 + fStack_1020 * fStack_1010;
            auVar101._12_4_ =
                 fStack_102c * fStack_fcc + fStack_103c * fStack_fec + fStack_101c * fStack_100c;
            fVar30 = (float)DAT_01f80d30;
            fVar50 = DAT_01f80d30._4_4_;
            fVar52 = DAT_01f80d30._8_4_;
            fVar87 = DAT_01f80d30._12_4_;
            auVar37._4_4_ = -(uint)(ABS(auVar101._4_4_) < fVar50);
            auVar37._0_4_ = -(uint)(ABS(auVar101._0_4_) < fVar30);
            auVar37._8_4_ = -(uint)(ABS(auVar101._8_4_) < fVar52);
            auVar37._12_4_ = -(uint)(ABS(auVar101._12_4_) < fVar87);
            auVar103 = blendvps(auVar101,_DAT_01f80d30,auVar37);
            local_1058._4_4_ = (float)((ulong)local_1058 >> 0x20);
            uStack_1050._4_4_ = (float)((ulong)uStack_1050 >> 0x20);
            auVar79._0_4_ =
                 local_1038 * (float)local_1058 + local_1048 * local_fe8 + local_1028 * local_1008;
            auVar79._4_4_ =
                 fStack_1034 * local_1058._4_4_ +
                 fStack_1044 * fStack_fe4 + fStack_1024 * fStack_1004;
            auVar79._8_4_ =
                 fStack_1030 * (float)uStack_1050 +
                 fStack_1040 * fStack_fe0 + fStack_1020 * fStack_1000;
            auVar79._12_4_ =
                 fStack_102c * uStack_1050._4_4_ +
                 fStack_103c * fStack_fdc + fStack_101c * fStack_ffc;
            auVar38._4_4_ = -(uint)(ABS(auVar79._4_4_) < fVar50);
            auVar38._0_4_ = -(uint)(ABS(auVar79._0_4_) < fVar30);
            auVar38._8_4_ = -(uint)(ABS(auVar79._8_4_) < fVar52);
            auVar38._12_4_ = -(uint)(ABS(auVar79._12_4_) < fVar87);
            auVar33 = blendvps(auVar79,_DAT_01f80d30,auVar38);
            local_1068._4_4_ = (float)((ulong)local_1068 >> 0x20);
            uStack_1060._4_4_ = (float)((ulong)uStack_1060 >> 0x20);
            auVar68._0_4_ =
                 local_1038 * *(float *)(uVar24 + 0x40) +
                 local_1048 * *(float *)(uVar24 + 0x70) + local_1028 * (float)local_1068;
            auVar68._4_4_ =
                 fStack_1034 * *(float *)(uVar24 + 0x44) +
                 fStack_1044 * *(float *)(uVar24 + 0x74) + fStack_1024 * local_1068._4_4_;
            auVar68._8_4_ =
                 fStack_1030 * *(float *)(uVar24 + 0x48) +
                 fStack_1040 * *(float *)(uVar24 + 0x78) + fStack_1020 * (float)uStack_1060;
            auVar68._12_4_ =
                 fStack_102c * *(float *)(uVar24 + 0x4c) +
                 fStack_103c * *(float *)(uVar24 + 0x7c) + fStack_101c * uStack_1060._4_4_;
            auVar39._4_4_ = -(uint)(ABS(auVar68._4_4_) < fVar50);
            auVar39._0_4_ = -(uint)(ABS(auVar68._0_4_) < fVar30);
            auVar39._8_4_ = -(uint)(ABS(auVar68._8_4_) < fVar52);
            auVar39._12_4_ = -(uint)(ABS(auVar68._12_4_) < fVar87);
            auVar64 = blendvps(auVar68,_DAT_01f80d30,auVar39);
            auVar32 = rcpps(auVar39,auVar103);
            fVar30 = auVar32._0_4_;
            fVar87 = auVar32._4_4_;
            fVar94 = auVar32._8_4_;
            fVar95 = auVar32._12_4_;
            fVar30 = (1.0 - auVar103._0_4_ * fVar30) * fVar30 + fVar30;
            fVar87 = (1.0 - auVar103._4_4_ * fVar87) * fVar87 + fVar87;
            fVar94 = (1.0 - auVar103._8_4_ * fVar94) * fVar94 + fVar94;
            fVar95 = (1.0 - auVar103._12_4_ * fVar95) * fVar95 + fVar95;
            auVar32 = rcpps(auVar32,auVar33);
            fVar50 = auVar32._0_4_;
            auVar80._0_4_ = auVar33._0_4_ * fVar50;
            fVar93 = auVar32._4_4_;
            auVar80._4_4_ = auVar33._4_4_ * fVar93;
            fVar86 = auVar32._8_4_;
            auVar80._8_4_ = auVar33._8_4_ * fVar86;
            fVar113 = auVar32._12_4_;
            auVar80._12_4_ = auVar33._12_4_ * fVar113;
            fVar50 = (1.0 - auVar80._0_4_) * fVar50 + fVar50;
            fVar93 = (1.0 - auVar80._4_4_) * fVar93 + fVar93;
            fVar86 = (1.0 - auVar80._8_4_) * fVar86 + fVar86;
            fVar113 = (1.0 - auVar80._12_4_) * fVar113 + fVar113;
            auVar32 = rcpps(auVar80,auVar64);
            fVar52 = auVar32._0_4_;
            fVar51 = auVar32._4_4_;
            fVar53 = auVar32._8_4_;
            fVar54 = auVar32._12_4_;
            fVar52 = (1.0 - auVar64._0_4_ * fVar52) * fVar52 + fVar52;
            fVar51 = (1.0 - auVar64._4_4_ * fVar51) * fVar51 + fVar51;
            fVar53 = (1.0 - auVar64._8_4_ * fVar53) * fVar53 + fVar53;
            fVar54 = (1.0 - auVar64._12_4_ * fVar54) * fVar54 + fVar54;
            fVar62 = local_fd8 * local_10b8 +
                     local_ff8 * fVar31 + local_1018 * local_1078 + *(float *)(uVar24 + 0xb0);
            fVar72 = fStack_fd4 * fStack_10b4 +
                     fStack_ff4 * fVar31 + fStack_1014 * fStack_1074 + *(float *)(uVar24 + 0xb4);
            fVar74 = fStack_fd0 * fStack_10b0 +
                     fStack_ff0 * fVar31 + fStack_1010 * fStack_1070 + *(float *)(uVar24 + 0xb8);
            fVar75 = fStack_fcc * fStack_10ac +
                     fStack_fec * fVar31 + fStack_100c * fStack_106c + *(float *)(uVar24 + 0xbc);
            fVar63 = (float)local_1058 * local_10b8 +
                     local_fe8 * fVar31 + local_1008 * local_1078 + *(float *)(uVar24 + 0xc0);
            fVar73 = local_1058._4_4_ * fStack_10b4 +
                     fStack_fe4 * fVar31 + fStack_1004 * fStack_1074 + *(float *)(uVar24 + 0xc4);
            fVar111 = (float)uStack_1050 * fStack_10b0 +
                      fStack_fe0 * fVar31 + fStack_1000 * fStack_1070 + *(float *)(uVar24 + 200);
            fVar76 = uStack_1050._4_4_ * fStack_10ac +
                     fStack_fdc * fVar31 + fStack_ffc * fStack_106c + *(float *)(uVar24 + 0xcc);
            fVar115 = *(float *)(uVar24 + 0x40) * local_10b8 +
                      *(float *)(uVar24 + 0x70) * fVar31 +
                      (float)local_1068 * local_1078 + *(float *)(uVar24 + 0xd0);
            fVar116 = *(float *)(uVar24 + 0x44) * fStack_10b4 +
                      *(float *)(uVar24 + 0x74) * fVar31 +
                      local_1068._4_4_ * fStack_1074 + *(float *)(uVar24 + 0xd4);
            fVar117 = *(float *)(uVar24 + 0x48) * fStack_10b0 +
                      *(float *)(uVar24 + 0x78) * fVar31 +
                      (float)uStack_1060 * fStack_1070 + *(float *)(uVar24 + 0xd8);
            fVar107 = *(float *)(uVar24 + 0x4c) * fStack_10ac +
                      *(float *)(uVar24 + 0x7c) * fVar31 +
                      uStack_1060._4_4_ * fStack_106c + *(float *)(uVar24 + 0xdc);
            fVar110 = ((*(float *)(uVar24 + 0xe0) * fVar5 + fVar97) - fVar62) * fVar30;
            fVar112 = ((*(float *)(uVar24 + 0xe4) * fVar5 + fVar97) - fVar72) * fVar87;
            fVar114 = ((*(float *)(uVar24 + 0xe8) * fVar5 + fVar97) - fVar74) * fVar94;
            fVar105 = ((*(float *)(uVar24 + 0xec) * fVar5 + fVar97) - fVar75) * fVar95;
            fVar30 = ((*(float *)(uVar24 + 0x110) * fVar5 + fVar96) - fVar62) * fVar30;
            fVar87 = ((*(float *)(uVar24 + 0x114) * fVar5 + fVar96) - fVar72) * fVar87;
            fVar94 = ((*(float *)(uVar24 + 0x118) * fVar5 + fVar96) - fVar74) * fVar94;
            fVar95 = ((*(float *)(uVar24 + 0x11c) * fVar5 + fVar96) - fVar75) * fVar95;
            fVar62 = (local_fc8 - fVar63) * fVar50;
            fVar72 = (fStack_fc4 - fVar73) * fVar93;
            fVar74 = (fStack_fc0 - fVar111) * fVar86;
            fVar75 = (fStack_fbc - fVar76) * fVar113;
            fVar98 = ((fVar97 + *(float *)(uVar24 + 0x100) * fVar5) - fVar115) * fVar52;
            fVar100 = ((fVar97 + *(float *)(uVar24 + 0x104) * fVar5) - fVar116) * fVar51;
            fVar102 = ((fVar97 + *(float *)(uVar24 + 0x108) * fVar5) - fVar117) * fVar53;
            fVar97 = ((fVar97 + *(float *)(uVar24 + 0x10c) * fVar5) - fVar107) * fVar54;
            fVar50 = ((*(float *)(uVar24 + 0x120) * fVar5 + fVar96) - fVar63) * fVar50;
            fVar93 = ((*(float *)(uVar24 + 0x124) * fVar5 + fVar96) - fVar73) * fVar93;
            fVar86 = ((*(float *)(uVar24 + 0x128) * fVar5 + fVar96) - fVar111) * fVar86;
            fVar113 = ((*(float *)(uVar24 + 300) * fVar5 + fVar96) - fVar76) * fVar113;
            fVar52 = ((fVar5 * *(float *)(uVar24 + 0x130) + fVar96) - fVar115) * fVar52;
            fVar51 = ((fVar5 * *(float *)(uVar24 + 0x134) + fVar96) - fVar116) * fVar51;
            fVar53 = ((fVar5 * *(float *)(uVar24 + 0x138) + fVar96) - fVar117) * fVar53;
            fVar54 = ((fVar5 * *(float *)(uVar24 + 0x13c) + fVar96) - fVar107) * fVar54;
            auVar40._0_4_ =
                 (uint)((int)fVar50 < (int)fVar62) * (int)fVar50 |
                 (uint)((int)fVar50 >= (int)fVar62) * (int)fVar62;
            auVar40._4_4_ =
                 (uint)((int)fVar93 < (int)fVar72) * (int)fVar93 |
                 (uint)((int)fVar93 >= (int)fVar72) * (int)fVar72;
            auVar40._8_4_ =
                 (uint)((int)fVar86 < (int)fVar74) * (int)fVar86 |
                 (uint)((int)fVar86 >= (int)fVar74) * (int)fVar74;
            auVar40._12_4_ =
                 (uint)((int)fVar113 < (int)fVar75) * (int)fVar113 |
                 (uint)((int)fVar113 >= (int)fVar75) * (int)fVar75;
            auVar69._0_4_ =
                 (uint)((int)fVar52 < (int)fVar98) * (int)fVar52 |
                 (uint)((int)fVar52 >= (int)fVar98) * (int)fVar98;
            auVar69._4_4_ =
                 (uint)((int)fVar51 < (int)fVar100) * (int)fVar51 |
                 (uint)((int)fVar51 >= (int)fVar100) * (int)fVar100;
            auVar69._8_4_ =
                 (uint)((int)fVar53 < (int)fVar102) * (int)fVar53 |
                 (uint)((int)fVar53 >= (int)fVar102) * (int)fVar102;
            auVar69._12_4_ =
                 (uint)((int)fVar54 < (int)fVar97) * (int)fVar54 |
                 (uint)((int)fVar54 >= (int)fVar97) * (int)fVar97;
            auVar32 = maxps(auVar40,auVar69);
            auVar70._0_4_ =
                 (uint)((int)fVar30 < (int)fVar110) * (int)fVar30 |
                 (uint)((int)fVar30 >= (int)fVar110) * (int)fVar110;
            auVar70._4_4_ =
                 (uint)((int)fVar87 < (int)fVar112) * (int)fVar87 |
                 (uint)((int)fVar87 >= (int)fVar112) * (int)fVar112;
            auVar70._8_4_ =
                 (uint)((int)fVar94 < (int)fVar114) * (int)fVar94 |
                 (uint)((int)fVar94 >= (int)fVar114) * (int)fVar114;
            auVar70._12_4_ =
                 (uint)((int)fVar95 < (int)fVar105) * (int)fVar95 |
                 (uint)((int)fVar95 >= (int)fVar105) * (int)fVar105;
            auVar104._0_4_ =
                 (uint)((int)fVar50 < (int)fVar62) * (int)fVar62 |
                 (uint)((int)fVar50 >= (int)fVar62) * (int)fVar50;
            auVar104._4_4_ =
                 (uint)((int)fVar93 < (int)fVar72) * (int)fVar72 |
                 (uint)((int)fVar93 >= (int)fVar72) * (int)fVar93;
            auVar104._8_4_ =
                 (uint)((int)fVar86 < (int)fVar74) * (int)fVar74 |
                 (uint)((int)fVar86 >= (int)fVar74) * (int)fVar86;
            auVar104._12_4_ =
                 (uint)((int)fVar113 < (int)fVar75) * (int)fVar75 |
                 (uint)((int)fVar113 >= (int)fVar75) * (int)fVar113;
            auVar16._4_4_ = fStack_1084;
            auVar16._0_4_ = local_1088;
            auVar16._8_4_ = fStack_1080;
            auVar16._12_4_ = fStack_107c;
            auVar59._0_4_ =
                 (uint)((int)fVar52 < (int)fVar98) * (int)fVar98 |
                 (uint)((int)fVar52 >= (int)fVar98) * (int)fVar52;
            auVar59._4_4_ =
                 (uint)((int)fVar51 < (int)fVar100) * (int)fVar100 |
                 (uint)((int)fVar51 >= (int)fVar100) * (int)fVar51;
            auVar59._8_4_ =
                 (uint)((int)fVar53 < (int)fVar102) * (int)fVar102 |
                 (uint)((int)fVar53 >= (int)fVar102) * (int)fVar53;
            auVar59._12_4_ =
                 (uint)((int)fVar54 < (int)fVar97) * (int)fVar97 |
                 (uint)((int)fVar54 >= (int)fVar97) * (int)fVar54;
            auVar33 = minps(auVar104,auVar59);
            auVar64 = maxps(auVar16,auVar70);
            auVar64 = maxps(auVar64,auVar32);
            auVar41._4_4_ = fVar55;
            auVar41._0_4_ = fVar92;
            auVar41._8_4_ = fVar56;
            auVar41._12_4_ = fVar57;
            auVar15._4_4_ =
                 (uint)((int)fVar87 < (int)fVar112) * (int)fVar112 |
                 (uint)((int)fVar87 >= (int)fVar112) * (int)fVar87;
            auVar15._0_4_ =
                 (uint)((int)fVar30 < (int)fVar110) * (int)fVar110 |
                 (uint)((int)fVar30 >= (int)fVar110) * (int)fVar30;
            auVar15._8_4_ =
                 (uint)((int)fVar94 < (int)fVar114) * (int)fVar114 |
                 (uint)((int)fVar94 >= (int)fVar114) * (int)fVar94;
            auVar15._12_4_ =
                 (uint)((int)fVar95 < (int)fVar105) * (int)fVar105 |
                 (uint)((int)fVar95 >= (int)fVar105) * (int)fVar95;
            auVar32 = minps(auVar41,auVar15);
            auVar32 = minps(auVar32,auVar33);
            local_1128._0_4_ = auVar64._0_4_ * 0.99999964;
            local_1128._4_4_ = auVar64._4_4_ * 0.99999964;
            fStack_1120 = auVar64._8_4_ * 0.99999964;
            fStack_111c = auVar64._12_4_ * 0.99999964;
            auVar60._4_4_ = -(uint)((float)local_1128._4_4_ <= auVar32._4_4_ * 1.0000004);
            auVar60._0_4_ = -(uint)((float)local_1128._0_4_ <= auVar32._0_4_ * 1.0000004);
            auVar60._8_4_ = -(uint)(fStack_1120 <= auVar32._8_4_ * 1.0000004);
            auVar60._12_4_ = -(uint)(fStack_111c <= auVar32._12_4_ * 1.0000004);
            uVar25 = movmskps((int)in_R8,auVar60);
            fVar52 = local_10c8;
            fVar93 = fStack_10c4;
            fVar51 = fStack_10c0;
            fVar94 = fStack_10bc;
            fVar87 = local_1088;
            fVar86 = fStack_1084;
            fVar53 = fStack_1080;
            fVar95 = fStack_107c;
            fVar113 = local_10a8;
            fVar54 = fStack_10a4;
            fVar62 = fStack_10a0;
            fVar63 = fStack_109c;
            fVar30 = local_10b8;
            fVar72 = fStack_10b4;
            fVar73 = fStack_10b0;
            fVar74 = fStack_10ac;
            fVar111 = local_10d8;
            fVar75 = fStack_10d4;
            fVar76 = fStack_10d0;
            fVar96 = fStack_10cc;
            fVar50 = local_1078;
            fVar97 = fStack_1074;
            fVar98 = fStack_1070;
            fVar100 = fStack_106c;
            fVar102 = local_1108;
            fVar110 = fStack_1104;
            fVar112 = fStack_1100;
            fVar114 = fStack_10fc;
            fVar105 = local_1118;
            fVar115 = fStack_1114;
            fVar116 = fStack_1110;
            fVar117 = fStack_110c;
            fVar107 = local_1098;
            fVar106 = fStack_1094;
            fVar108 = fStack_1090;
            fVar109 = fStack_108c;
            local_1068 = uVar18;
            uStack_1060 = uVar19;
            local_1058 = uVar20;
            uStack_1050 = uVar21;
          }
          else {
            pfVar3 = (float *)(uVar24 + 0x80 + uVar26);
            pfVar1 = (float *)(uVar24 + 0x20 + uVar26);
            pfVar4 = (float *)(uVar24 + 0x80 + uVar28);
            pfVar2 = (float *)(uVar24 + 0x20 + uVar28);
            auVar65._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar30) * fVar52;
            auVar65._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar72) * fVar93;
            auVar65._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar73) * fVar51;
            auVar65._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar74) * fVar94;
            auVar77._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar31) * fVar111;
            auVar77._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar31) * fVar75;
            auVar77._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar31) * fVar76;
            auVar77._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar31) * fVar96;
            pfVar2 = (float *)(uVar24 + 0x80 + uVar27);
            pfVar1 = (float *)(uVar24 + 0x20 + uVar27);
            auVar35._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar50) * fVar113;
            auVar35._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar97) * fVar54;
            auVar35._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar98) * fVar62;
            auVar35._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar100) * fVar63;
            auVar64 = maxps(auVar77,auVar35);
            auVar36._4_4_ = fVar86;
            auVar36._0_4_ = fVar87;
            auVar36._8_4_ = fVar53;
            auVar36._12_4_ = fVar95;
            auVar32 = maxps(auVar36,auVar65);
            pfVar2 = (float *)(uVar24 + 0x80 + (uVar26 ^ 0x10));
            pfVar1 = (float *)(uVar24 + 0x20 + (uVar26 ^ 0x10));
            _local_1128 = maxps(auVar32,auVar64);
            auVar84._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar30) * fVar102;
            auVar84._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar72) * fVar110;
            auVar84._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar73) * fVar112;
            auVar84._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar74) * fVar114;
            pfVar3 = (float *)(uVar24 + 0x80 + (uVar28 ^ 0x10));
            pfVar1 = (float *)(uVar24 + 0x20 + (uVar28 ^ 0x10));
            pfVar4 = (float *)(uVar24 + 0x80 + (uVar27 ^ 0x10));
            pfVar2 = (float *)(uVar24 + 0x20 + (uVar27 ^ 0x10));
            auVar78._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar31) * fVar105;
            auVar78._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar31) * fVar115;
            auVar78._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar31) * fVar116;
            auVar78._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar31) * fVar117;
            auVar66._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar50) * fVar107;
            auVar66._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar97) * fVar106;
            auVar66._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar98) * fVar108;
            auVar66._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar100) * fVar109;
            auVar64 = minps(auVar78,auVar66);
            auVar67._4_4_ = fVar55;
            auVar67._0_4_ = fVar92;
            auVar67._8_4_ = fVar56;
            auVar67._12_4_ = fVar57;
            auVar32 = minps(auVar67,auVar84);
            auVar32 = minps(auVar32,auVar64);
            if (uVar25 == 6) {
              bVar11 = (fVar5 < *(float *)(uVar24 + 0xf0) && *(float *)(uVar24 + 0xe0) <= fVar5) &&
                       local_1128._0_4_ <= auVar32._0_4_;
              bVar12 = (fVar5 < *(float *)(uVar24 + 0xf4) && *(float *)(uVar24 + 0xe4) <= fVar5) &&
                       local_1128._4_4_ <= auVar32._4_4_;
              bVar13 = (fVar5 < *(float *)(uVar24 + 0xf8) && *(float *)(uVar24 + 0xe8) <= fVar5) &&
                       local_1128._8_4_ <= auVar32._8_4_;
              bVar14 = (fVar5 < *(float *)(uVar24 + 0xfc) && *(float *)(uVar24 + 0xec) <= fVar5) &&
                       local_1128._12_4_ <= auVar32._12_4_;
            }
            else {
              bVar11 = local_1128._0_4_ <= auVar32._0_4_;
              bVar12 = local_1128._4_4_ <= auVar32._4_4_;
              bVar13 = local_1128._8_4_ <= auVar32._8_4_;
              bVar14 = local_1128._12_4_ <= auVar32._12_4_;
            }
            auVar58._0_4_ = (uint)bVar11 * -0x80000000;
            auVar58._4_4_ = (uint)bVar12 * -0x80000000;
            auVar58._8_4_ = (uint)bVar13 * -0x80000000;
            auVar58._12_4_ = (uint)bVar14 * -0x80000000;
            uVar25 = movmskps((int)in_R8,auVar58);
          }
          in_R8 = (void *)CONCAT44((int)((ulong)in_R8 >> 0x20),uVar25);
          if (in_R8 == (void *)0x0) goto LAB_00d8cbf0;
          lVar10 = 0;
          if (in_R8 != (void *)0x0) {
            for (; ((ulong)in_R8 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          pvVar23 = *(void **)(uVar24 + lVar10 * 8);
          uVar25 = uVar25 - 1 & uVar25;
          if (uVar25 != 0) {
            uVar7 = *(uint *)(local_1128 + lVar10 * 4);
            lVar10 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            pvVar9 = *(void **)(uVar24 + lVar10 * 8);
            uVar8 = *(uint *)(local_1128 + lVar10 * 4);
            uVar25 = uVar25 - 1 & uVar25;
            if (uVar25 == 0) {
              in_R8 = pvVar9;
              if (uVar7 < uVar8) {
                *(void **)*pauVar22 = pvVar9;
                *(uint *)((long)*pauVar22 + 8) = uVar8;
                pauVar22 = pauVar22 + 1;
              }
              else {
                *(void **)*pauVar22 = pvVar23;
                *(uint *)((long)*pauVar22 + 8) = uVar7;
                pauVar22 = pauVar22 + 1;
                pvVar23 = pvVar9;
              }
            }
            else {
              auVar61._8_4_ = uVar7;
              auVar61._0_8_ = pvVar23;
              auVar61._12_4_ = 0;
              auVar81._8_4_ = uVar8;
              auVar81._0_8_ = pvVar9;
              auVar81._12_4_ = 0;
              lVar10 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              in_R8 = *(void **)(uVar24 + lVar10 * 8);
              iVar29 = *(int *)(local_1128 + lVar10 * 4);
              auVar71._8_4_ = iVar29;
              auVar71._0_8_ = in_R8;
              auVar71._12_4_ = 0;
              auVar42._8_4_ = -(uint)((int)uVar7 < (int)uVar8);
              uVar25 = uVar25 - 1 & uVar25;
              if (uVar25 == 0) {
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar85._8_4_ = uVar8;
                auVar85._0_8_ = pvVar9;
                auVar85._12_4_ = 0;
                auVar64 = blendvps(auVar85,auVar61,auVar42);
                auVar32 = blendvps(auVar61,auVar81,auVar42);
                auVar43._8_4_ = -(uint)(auVar64._8_4_ < iVar29);
                auVar43._4_4_ = auVar43._8_4_;
                auVar43._0_4_ = auVar43._8_4_;
                auVar43._12_4_ = auVar43._8_4_;
                auVar82._8_4_ = iVar29;
                auVar82._0_8_ = in_R8;
                auVar82._12_4_ = 0;
                auVar33 = blendvps(auVar82,auVar64,auVar43);
                auVar103 = blendvps(auVar64,auVar71,auVar43);
                auVar44._8_4_ = -(uint)(auVar32._8_4_ < auVar103._8_4_);
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar64 = blendvps(auVar103,auVar32,auVar44);
                auVar32 = blendvps(auVar32,auVar103,auVar44);
                *pauVar22 = auVar32;
                pauVar22[1] = auVar64;
                pvVar23 = auVar33._0_8_;
                pauVar22 = pauVar22 + 2;
              }
              else {
                lVar10 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                auVar45._4_4_ = auVar42._8_4_;
                auVar45._0_4_ = auVar42._8_4_;
                auVar45._8_4_ = auVar42._8_4_;
                auVar45._12_4_ = auVar42._8_4_;
                auVar103 = blendvps(auVar81,auVar61,auVar45);
                auVar32 = blendvps(auVar61,auVar81,auVar45);
                auVar90._8_4_ = *(int *)(local_1128 + lVar10 * 4);
                auVar90._0_8_ = *(undefined8 *)(uVar24 + lVar10 * 8);
                auVar90._12_4_ = 0;
                auVar46._8_4_ = -(uint)(iVar29 < *(int *)(local_1128 + lVar10 * 4));
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar33 = blendvps(auVar90,auVar71,auVar46);
                auVar64 = blendvps(auVar71,auVar90,auVar46);
                auVar47._8_4_ = -(uint)(auVar32._8_4_ < auVar64._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar91 = blendvps(auVar64,auVar32,auVar47);
                auVar32 = blendvps(auVar32,auVar64,auVar47);
                auVar48._8_4_ = -(uint)(auVar103._8_4_ < auVar33._8_4_);
                auVar48._4_4_ = auVar48._8_4_;
                auVar48._0_4_ = auVar48._8_4_;
                auVar48._12_4_ = auVar48._8_4_;
                auVar64 = blendvps(auVar33,auVar103,auVar48);
                auVar103 = blendvps(auVar103,auVar33,auVar48);
                auVar49._8_4_ = -(uint)(auVar103._8_4_ < auVar91._8_4_);
                auVar49._4_4_ = auVar49._8_4_;
                auVar49._0_4_ = auVar49._8_4_;
                auVar49._12_4_ = auVar49._8_4_;
                auVar33 = blendvps(auVar91,auVar103,auVar49);
                auVar103 = blendvps(auVar103,auVar91,auVar49);
                *pauVar22 = auVar32;
                pauVar22[1] = auVar103;
                pauVar22[2] = auVar33;
                pvVar23 = auVar64._0_8_;
                pauVar22 = pauVar22 + 3;
                fVar102 = local_1108;
                fVar110 = fStack_1104;
                fVar112 = fStack_1100;
                fVar114 = fStack_10fc;
                fVar105 = local_1118;
                fVar115 = fStack_1114;
                fVar116 = fStack_1110;
                fVar117 = fStack_110c;
              }
            }
          }
        }
        in_R8 = local_10e8->leafIntersector;
        (**(code **)((long)in_R8 + (ulong)*(byte *)((ulong)pvVar23 & 0xfffffffffffffff0) * 0x40))
                  (local_fb8,ray,local_10e0);
        fVar92 = (local_10f0->super_RayK<1>).tfar;
        ray = local_10f0;
        fVar55 = fVar92;
        fVar56 = fVar92;
        fVar57 = fVar92;
        fVar52 = local_10c8;
        fVar93 = fStack_10c4;
        fVar51 = fStack_10c0;
        fVar94 = fStack_10bc;
        fVar87 = local_1088;
        fVar86 = fStack_1084;
        fVar53 = fStack_1080;
        fVar95 = fStack_107c;
        fVar113 = local_10a8;
        fVar54 = fStack_10a4;
        fVar62 = fStack_10a0;
        fVar63 = fStack_109c;
        fVar30 = local_10b8;
        fVar72 = fStack_10b4;
        fVar73 = fStack_10b0;
        fVar74 = fStack_10ac;
        fVar111 = local_10d8;
        fVar75 = fStack_10d4;
        fVar76 = fStack_10d0;
        fVar96 = fStack_10cc;
        fVar50 = local_1078;
        fVar97 = fStack_1074;
        fVar98 = fStack_1070;
        fVar100 = fStack_106c;
        fVar102 = local_1108;
        fVar110 = fStack_1104;
        fVar112 = fStack_1100;
        fVar114 = fStack_10fc;
        fVar105 = local_1118;
        fVar115 = fStack_1114;
        fVar116 = fStack_1110;
        fVar117 = fStack_110c;
        fVar107 = local_1098;
        fVar106 = fStack_1094;
        fVar108 = fStack_1090;
        fVar109 = fStack_108c;
      }
LAB_00d8cbf0:
    } while (pauVar22 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }